

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

void __thiscall
bsim::quad_value_bit_vector::quad_value_bit_vector
          (quad_value_bit_vector *this,int N_,string *str_raw)

{
  char cVar1;
  size_type sVar2;
  uint v;
  int iVar3;
  long lVar4;
  ulong uVar5;
  string str;
  
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->N = N_;
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  lVar4 = 0;
  iVar3 = 0;
  do {
    sVar2 = str._M_string_length;
    if ((int)str_raw->_M_string_length <= lVar4) {
      if (iVar3 <= this->N) {
        std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize
                  (&this->bits,(long)this->N);
        uVar5 = sVar2 & 0xffffffff;
        iVar3 = 0;
        while (0 < (int)uVar5) {
          cVar1 = str._M_dataplus._M_p[uVar5 - 1];
          uVar5 = uVar5 - 1;
          v = (uint)(cVar1 != '0');
          if (cVar1 == 'x') {
            v = 2;
          }
          if (cVar1 == 'z') {
            v = 3;
          }
          set(this,iVar3,v);
          iVar3 = iVar3 + 1;
        }
        iVar3 = this->N;
        while ((int)sVar2 < iVar3) {
          iVar3 = iVar3 + -1;
          set(this,iVar3,0);
        }
        std::__cxx11::string::~string((string *)&str);
        return;
      }
      __assert_fail("num_digits <= N",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                    ,0x180,
                    "bsim::quad_value_bit_vector::quad_value_bit_vector(const int, const std::string &)"
                   );
    }
    cVar1 = (str_raw->_M_dataplus)._M_p[lVar4];
    if ((int)cVar1 - 0x30U < 10) {
      std::__cxx11::string::push_back((char)&str);
      iVar3 = iVar3 + 1;
    }
    else if (cVar1 != '_') {
      if ((cVar1 != 'z') && (cVar1 != 'x')) {
        __assert_fail("str_raw[i] == \'_\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0x17d,
                      "bsim::quad_value_bit_vector::quad_value_bit_vector(const int, const std::string &)"
                     );
      }
      std::__cxx11::string::push_back((char)&str);
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

quad_value_bit_vector(const int N_, const std::string& str_raw) : N(N_) {
      int num_digits = 0;
      std::string str;
      for (int i = 0; i < ((int) str_raw.size()); i++) {
	if (isdigit(str_raw[i])) {
	  num_digits++;
	  str += str_raw[i];
	} else if (str_raw[i] == 'z') {
          str += str_raw[i];
        } else if (str_raw[i] == 'x') {
          str += str_raw[i];
        } else {
	  assert(str_raw[i] == '_');
	}
      }
      assert(num_digits <= N);

      int len = str.size();      

      bits.resize(N);
      for (int i = len - 1; i >= 0; i--) {
        unsigned char val = (str[i] == '0') ? 0 : 1;
        if (str[i] == 'x') {
          val = QBV_UNKNOWN_VALUE;
        }
        if (str[i] == 'z') {
          val = QBV_HIGH_IMPEDANCE_VALUE;
        }

        int ind = len - i - 1;
        set(ind, val);
      }
      for (int i = N - 1; i >= len; i--) {
        set(i,0);
      }
    }